

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createSamplerTests(TestContext *testCtx)

{
  VkImageViewType imageViewType;
  VkFormat format;
  VkSamplerAddressMode value;
  VkSamplerAddressMode value_00;
  VkSamplerAddressMode value_01;
  _Alloc_hider name;
  bool bVar1;
  VkBorderColor VVar2;
  long *plVar3;
  char *pcVar4;
  TestNode *pTVar5;
  SamplerTest *pSVar6;
  TestNode *this;
  TestNode *pTVar7;
  size_t sVar8;
  ostream *poVar9;
  size_type *psVar10;
  long lVar11;
  string fullName_1;
  string fullNameV;
  string fullNameW;
  string fullName;
  string local_350;
  string local_330;
  TestNode *local_310;
  TestNode *local_308;
  TestNode *local_300;
  TestNode *local_2f8;
  TestNode *local_2f0;
  TestNode *local_2e8;
  long local_2e0;
  long local_2d8;
  string local_2d0;
  VkSamplerAddressMode local_2ac;
  SamplerTest *local_2a8;
  TestContext *local_2a0;
  ulong local_298;
  string local_290;
  string local_270;
  string local_250;
  long local_230;
  long *local_228;
  long local_218 [2];
  string local_208;
  string local_1e8;
  string local_1c8;
  TestNode *local_1a8;
  long local_1a0;
  undefined1 local_198 [360];
  
  local_2e8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_2e8,testCtx,"sampler","Sampler tests");
  local_308 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_308,testCtx,"view_type","");
  lVar11 = 0;
  local_2a0 = testCtx;
  do {
    imageViewType = (&DAT_00d29b50)[lVar11 * 4];
    local_230 = lVar11;
    local_300 = (TestNode *)operator_new(0x70);
    pcVar4 = (char *)(&DAT_00d29b58)[lVar11 * 2];
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Uses a ","");
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_330);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    psVar10 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_350.field_2._M_allocated_capacity = *psVar10;
      local_350.field_2._8_8_ = plVar3[3];
    }
    else {
      local_350.field_2._M_allocated_capacity = *psVar10;
      local_350._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_350._M_string_length = plVar3[1];
    *plVar3 = (long)psVar10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_1a8 = (TestNode *)local_198;
    pTVar5 = (TestNode *)(plVar3 + 2);
    if ((TestNode *)*plVar3 == pTVar5) {
      local_198._0_8_ = pTVar5->_vptr_TestNode;
      local_198._8_8_ = plVar3[3];
    }
    else {
      local_198._0_8_ = pTVar5->_vptr_TestNode;
      local_1a8 = (TestNode *)*plVar3;
    }
    local_1a0 = plVar3[1];
    *plVar3 = (long)pTVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_300,testCtx,pcVar4,(char *)local_1a8);
    if (local_1a8 != (TestNode *)local_198) {
      operator_delete(local_1a8,local_198._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    local_2f8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_2f8,testCtx,"format","Tests samplable formats");
    local_2e0 = 0;
    do {
      format = *(VkFormat *)(&DAT_00aea250 + local_2e0 * 4);
      bVar1 = ::vk::isCompressedFormat(format);
      if (bVar1 && (imageViewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) break;
      local_310 = (TestNode *)operator_new(0x70);
      pcVar4 = ::vk::getFormatName(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar4,(allocator<char> *)&local_350);
      std::__cxx11::string::substr((ulong)&local_350,(ulong)&local_1a8);
      de::toLower(&local_330,&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != (TestNode *)local_198) {
        operator_delete(local_1a8,local_198._0_8_ + 1);
      }
      name._M_p = local_330._M_dataplus._M_p;
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,"Samples a texture of format ","");
      ::vk::getFormatName(format);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_350);
      local_1a8 = (TestNode *)local_198;
      pTVar5 = (TestNode *)(plVar3 + 2);
      if ((TestNode *)*plVar3 == pTVar5) {
        local_198._0_8_ = pTVar5->_vptr_TestNode;
        local_198._8_8_ = plVar3[3];
      }
      else {
        local_198._0_8_ = pTVar5->_vptr_TestNode;
        local_1a8 = (TestNode *)*plVar3;
      }
      local_1a0 = plVar3[1];
      *plVar3 = (long)pTVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_310,testCtx,name._M_p,(char *)local_1a8);
      if (local_1a8 != (TestNode *)local_198) {
        operator_delete(local_1a8,local_198._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if (!bVar1) {
        pTVar5 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar5,testCtx,"min_filter","Tests for minification filter");
        bVar1 = ::vk::isCompressedFormat(format);
        if (bVar1) {
LAB_0050116d:
          pSVar6 = (SamplerTest *)operator_new(0x128);
          anon_unknown_0::SamplerTest::SamplerTest
                    (pSVar6,testCtx,"linear","Minifies image using VK_TEX_FILTER_LINEAR",
                     imageViewType,format,0x20,0.0);
          (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__TestCase_00d29bd0;
          *(undefined4 *)&pSVar6->field_0x124 = 1;
          tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar6);
        }
        else {
          bVar1 = ::vk::isIntFormat(format);
          if (!bVar1) {
            bVar1 = ::vk::isUintFormat(format);
            if (!bVar1) goto LAB_0050116d;
          }
        }
        pSVar6 = (SamplerTest *)operator_new(0x128);
        anon_unknown_0::SamplerTest::SamplerTest
                  (pSVar6,testCtx,"nearest","Minifies image using VK_TEX_FILTER_NEAREST",
                   imageViewType,format,0x20,0.0);
        (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TestCase_00d29bd0;
        *(undefined4 *)&pSVar6->field_0x124 = 0;
        tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar6);
        tcu::TestNode::addChild(local_310,pTVar5);
      }
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,testCtx,"mag_filter","Tests for magnification filter");
      bVar1 = ::vk::isCompressedFormat(format);
      if (bVar1) {
LAB_0050127d:
        pSVar6 = (SamplerTest *)operator_new(0x128);
        anon_unknown_0::SamplerTest::SamplerTest
                  (pSVar6,testCtx,"linear","Magnifies image using VK_TEX_FILTER_LINEAR",
                   imageViewType,format,8,0.0);
        (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TestCase_00d29cc0;
        *(undefined4 *)&pSVar6->field_0x124 = 1;
        tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar6);
      }
      else {
        bVar1 = ::vk::isIntFormat(format);
        if (!bVar1) {
          bVar1 = ::vk::isUintFormat(format);
          if (!bVar1) goto LAB_0050127d;
        }
      }
      pSVar6 = (SamplerTest *)operator_new(0x128);
      anon_unknown_0::SamplerTest::SamplerTest
                (pSVar6,testCtx,"nearest","Magnifies image using VK_TEX_FILTER_NEAREST",
                 imageViewType,format,8,0.0);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00d29cc0;
      *(undefined4 *)&pSVar6->field_0x124 = 0;
      tcu::TestNode::addChild(pTVar5,(TestNode *)pSVar6);
      this = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)this,testCtx,"mipmap","Tests for mipmap modes");
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,testCtx,"nearest","Uses VK_TEX_MIPMAP_MODE_NEAREST");
      anon_unknown_0::createSamplerLodTests
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&local_1a8,
                 testCtx,imageViewType,format,VK_SAMPLER_MIPMAP_MODE_NEAREST);
      tcu::TestNode::addChild(pTVar7,local_1a8);
      tcu::TestNode::addChild(this,pTVar7);
      bVar1 = ::vk::isCompressedFormat(format);
      if (bVar1) {
LAB_005013d7:
        pTVar7 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar7,testCtx,"linear","Uses VK_TEX_MIPMAP_MODE_LINEAR");
        anon_unknown_0::createSamplerLodTests
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                   &local_1a8,testCtx,imageViewType,format,VK_SAMPLER_MIPMAP_MODE_LINEAR);
        tcu::TestNode::addChild(pTVar7,local_1a8);
        tcu::TestNode::addChild(this,pTVar7);
      }
      else {
        bVar1 = ::vk::isIntFormat(format);
        if (!bVar1) {
          bVar1 = ::vk::isUintFormat(format);
          if (!bVar1) goto LAB_005013d7;
        }
      }
      pTVar7 = local_310;
      tcu::TestNode::addChild(local_310,pTVar5);
      tcu::TestNode::addChild(pTVar7,this);
      if ((imageViewType != VK_IMAGE_VIEW_TYPE_CUBE) &&
         (imageViewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
        local_2f0 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_2f0,testCtx,"address_modes","Tests for address modes");
        local_2d8 = 0xc;
        do {
          local_2a8 = (SamplerTest *)operator_new(0x138);
          value = *(VkSamplerAddressMode *)(&UNK_00aea414 + local_2d8);
          value_00 = *(VkSamplerAddressMode *)(&UNK_00aea418 + local_2d8);
          value_01 = *(VkSamplerAddressMode *)(&UNK_00aea41c + local_2d8);
          local_298 = (ulong)*(uint *)((long)&DAT_00aea420 + local_2d8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          if (value_00 == value_01 && value == value_00) {
            pcVar4 = ::vk::getSamplerAddressModeName(value);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,pcVar4,(allocator<char> *)&local_330);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"all_",4);
            std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_350);
            de::toLower(&local_330,&local_2d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_330._M_dataplus._M_p,local_330._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (value == VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"_",1);
              pcVar4 = *(char **)((anonymous_namespace)::
                                  getAddressModesCaseName[abi:cxx11](vk::VkSamplerAddressMode,vk::VkSamplerAddressMode,vk::VkSamplerAddressMode,vkt::pipeline::BorderColor)
                                  ::borderColorNames + local_298 * 8);
              sVar8 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar8)
              ;
            }
          }
          else {
            pcVar4 = ::vk::getSamplerAddressModeName(value);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,pcVar4,(allocator<char> *)&local_330);
            pcVar4 = ::vk::getSamplerAddressModeName(value_00);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_330,pcVar4,(allocator<char> *)&local_2d0);
            pcVar4 = ::vk::getSamplerAddressModeName(value_01);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d0,pcVar4,(allocator<char> *)&local_290);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"uvw",3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"_",1);
            std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_350);
            de::toLower(&local_290,&local_1c8);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1a8,local_290._M_dataplus._M_p,
                                local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
            std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_330);
            de::toLower(&local_250,&local_1e8);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
            std::__cxx11::string::substr((ulong)&local_208,(ulong)&local_2d0);
            de::toLower(&local_270,&local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,local_270._M_dataplus._M_p,local_270._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          local_2ac = value_01;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
          plVar3 = local_228;
          pSVar6 = local_2a8;
          VVar2 = getFormatBorderColor((BorderColor)local_298,format);
          anon_unknown_0::SamplerTest::SamplerTest
                    (pSVar6,local_2a0,(char *)plVar3,"",imageViewType,format,8,0.0);
          (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__TestCase_00d29eb8;
          *(VkSamplerAddressMode *)&pSVar6->field_0x124 = value;
          *(VkSamplerAddressMode *)
           &pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = value_00;
          *(VkSamplerAddressMode *)
           ((long)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               local_2ac;
          *(VkBorderColor *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
               VVar2;
          tcu::TestNode::addChild(local_2f0,(TestNode *)pSVar6);
          if (local_228 != local_218) {
            operator_delete(local_228,local_218[0] + 1);
          }
          testCtx = local_2a0;
          local_2d8 = local_2d8 + 0x10;
        } while (local_2d8 != 0x1dc);
        tcu::TestNode::addChild(local_310,local_2f0);
      }
      tcu::TestNode::addChild(local_2f8,local_310);
      local_2e0 = local_2e0 + 1;
    } while (local_2e0 != 0x40);
    pTVar5 = local_300;
    tcu::TestNode::addChild(local_300,local_2f8);
    tcu::TestNode::addChild(local_308,pTVar5);
    pTVar5 = local_2e8;
    lVar11 = local_230 + 1;
    if (lVar11 == 7) {
      tcu::TestNode::addChild(local_2e8,local_308);
      return (TestCaseGroup *)pTVar5;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSamplerTests (tcu::TestContext& testCtx)
{
	const struct
	{
		VkImageViewType		type;
		const char*			name;
	}
	imageViewTypes[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D,			"1d" },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		"1d_array" },
		{ VK_IMAGE_VIEW_TYPE_2D,			"2d" },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		"2d_array" },
		{ VK_IMAGE_VIEW_TYPE_3D,			"3d" },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			"cube" },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	"cube_array" }
	};

	const VkFormat formats[] =
	{
		// Packed formats
		VK_FORMAT_R4G4_UNORM_PACK8,
		VK_FORMAT_R4G4B4A4_UNORM_PACK16,
		VK_FORMAT_R5G6B5_UNORM_PACK16,
		VK_FORMAT_R5G5B5A1_UNORM_PACK16,
		VK_FORMAT_A2B10G10R10_UNORM_PACK32,
		VK_FORMAT_A2R10G10B10_UINT_PACK32,
		VK_FORMAT_B10G11R11_UFLOAT_PACK32,
		VK_FORMAT_E5B9G9R9_UFLOAT_PACK32,
		VK_FORMAT_B4G4R4A4_UNORM_PACK16,
		VK_FORMAT_B5G5R5A1_UNORM_PACK16,

		// Pairwise combinations of 8-bit channel formats, UNORM/SNORM/SINT/UINT/SRGB type x 1-to-4 channels x RGBA/BGRA order
		VK_FORMAT_R8_SRGB,
		VK_FORMAT_R8G8B8_UINT,
		VK_FORMAT_B8G8R8A8_SINT,
		VK_FORMAT_R8G8_UNORM,
		VK_FORMAT_B8G8R8_SNORM,
		VK_FORMAT_R8G8B8A8_SNORM,
		VK_FORMAT_R8G8_UINT,
		VK_FORMAT_R8_SINT,
		VK_FORMAT_R8G8B8A8_SRGB,
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_B8G8R8A8_UNORM,
		VK_FORMAT_B8G8R8_SRGB,
		VK_FORMAT_R8G8_SRGB,
		VK_FORMAT_R8_UINT,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R8G8_SINT,
		VK_FORMAT_R8_SNORM,
		VK_FORMAT_B8G8R8_SINT,
		VK_FORMAT_R8G8_SNORM,
		VK_FORMAT_B8G8R8_UNORM,
		VK_FORMAT_R8_UNORM,

		// Pairwise combinations of 16/32-bit channel formats x SINT/UINT/SFLOAT type x 1-to-4 channels
		VK_FORMAT_R32G32_SFLOAT,
		VK_FORMAT_R32G32B32_UINT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R16G16_UINT,
		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R16G16B16_SINT,
		VK_FORMAT_R16_SFLOAT,
		VK_FORMAT_R32_SINT,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R16G16B16_SFLOAT,
		VK_FORMAT_R16G16_SINT,

		// Scaled formats
		VK_FORMAT_R8G8B8A8_SSCALED,
		VK_FORMAT_A2R10G10B10_USCALED_PACK32,

		// Compressed formats
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	de::MovePtr<tcu::TestCaseGroup> samplerTests		(new tcu::TestCaseGroup(testCtx, "sampler", "Sampler tests"));
	de::MovePtr<tcu::TestCaseGroup> viewTypeTests		(new tcu::TestCaseGroup(testCtx, "view_type", ""));

	for (int viewTypeNdx = 0; viewTypeNdx < DE_LENGTH_OF_ARRAY(imageViewTypes); viewTypeNdx++)
	{
		const VkImageViewType			viewType		= imageViewTypes[viewTypeNdx].type;
		de::MovePtr<tcu::TestCaseGroup>	viewTypeGroup	(new tcu::TestCaseGroup(testCtx, imageViewTypes[viewTypeNdx].name, (std::string("Uses a ") + imageViewTypes[viewTypeNdx].name + " view").c_str()));
		de::MovePtr<tcu::TestCaseGroup>	formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Tests samplable formats"));

		for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			const VkFormat	format			= formats[formatNdx];
			const bool		isCompressed	= isCompressedFormat(format);

			if (isCompressed)
			{
				// Do not use compressed formats with 1D and 1D array textures.
				if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY)
					break;
			}

			de::MovePtr<tcu::TestCaseGroup>	formatGroup	(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(format).c_str(),
																				(std::string("Samples a texture of format ") + getFormatName(format)).c_str()));

			if (!isCompressed)
			{
				// Do not include minFilter tests with compressed formats.
				// Randomly generated compressed textures are too noisy and will derive in false positives.
				de::MovePtr<tcu::TestCaseGroup>	minFilterTests		= createSamplerMinFilterTests(testCtx, viewType, format);
				formatGroup->addChild(minFilterTests.release());
			}

			de::MovePtr<tcu::TestCaseGroup>	magFilterTests		= createSamplerMagFilterTests(testCtx, viewType, format);
			de::MovePtr<tcu::TestCaseGroup>	mipmapTests			= createSamplerMipmapTests(testCtx, viewType, format);

			formatGroup->addChild(magFilterTests.release());
			formatGroup->addChild(mipmapTests.release());

			if (viewType != VK_IMAGE_VIEW_TYPE_CUBE && viewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
			{
				de::MovePtr<tcu::TestCaseGroup>	addressModesTests	= createSamplerAddressModesTests(testCtx, viewType, format);
				formatGroup->addChild(addressModesTests.release());
			}

			formatTests->addChild(formatGroup.release());
		}

		viewTypeGroup->addChild(formatTests.release());
		viewTypeTests->addChild(viewTypeGroup.release());
	}

	samplerTests->addChild(viewTypeTests.release());

	return samplerTests.release();
}